

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O1

bool __thiscall
glcts::ViewportArray::DepthRange::checkResults
          (DepthRange *this,texture *texture_0,texture *param_2,GLuint param_3)

{
  ostringstream *this_00;
  float fVar1;
  float fVar2;
  float fVar3;
  GLuint i;
  long lVar4;
  bool bVar5;
  bool bVar6;
  float fVar7;
  vector<float,_std::allocator<float>_> texture_data;
  GLfloat depth_data [32];
  vector<float,_std::allocator<float>_> local_298;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  float afStack_238 [34];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_298.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_298.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_298.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::resize(&local_298,0x20);
  Utils::texture::get(texture_0,0x1903,0x1406,
                      local_298.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
  lVar4 = 0;
  do {
    fVar7 = (float)(int)lVar4 * 0.0625;
    afStack_238[lVar4 * 2] = fVar7;
    afStack_238[lVar4 * 2 + 1] = 1.0 - fVar7;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  this_00 = (ostringstream *)(local_1b0 + 8);
  bVar5 = true;
  lVar4 = 0;
  do {
    fVar7 = afStack_238[lVar4 * 2];
    fVar1 = afStack_238[lVar4 * 2 + 1];
    fVar2 = local_298.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[lVar4];
    fVar3 = local_298.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[lVar4 + 0x10];
    local_278 = ZEXT416((uint)fVar3);
    local_248 = ZEXT416((uint)fVar7);
    local_268 = ZEXT416((uint)fVar2);
    local_258 = ZEXT416((uint)fVar1);
    if (fVar7 != fVar2 || fVar3 != fVar1) {
      local_1b0._0_8_ = ((this->super_DrawTestBase).super_TestCaseBase.m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Invalid values at ",0x12);
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," expected [",0xb);
      std::ostream::_M_insert<double>((double)(float)local_248._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
      std::ostream::_M_insert<double>((double)(float)local_258._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"] got [",7);
      std::ostream::_M_insert<double>((double)(float)local_268._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
      std::ostream::_M_insert<double>((double)(float)local_278._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_138);
      bVar5 = false;
    }
    bVar6 = lVar4 != 0xf;
    lVar4 = lVar4 + 1;
  } while ((fVar7 == fVar2 && fVar3 == fVar1) && bVar6);
  if (local_298.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_298.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_298.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar5;
}

Assistant:

bool DepthRange::checkResults(Utils::texture& texture_0, Utils::texture& /* texture_1 */, GLuint /*draw_call_index */)
{
	static const GLfloat step = 1.0f / 16.0f;

	bool check_result = true;

	std::vector<GLfloat> texture_data;
	texture_data.resize(m_r32f_width * m_r32f_height);
	texture_0.get(GL_RED, GL_FLOAT, &texture_data[0]);

	GLfloat depth_data[16 * 2];

	for (GLuint i = 0; i < 16; ++i)
	{
		const GLfloat near = step * (GLfloat)i;

		depth_data[i * 2 + 0] = near;
		depth_data[i * 2 + 1] = 1.0f - near;
	}

	for (GLuint i = 0; i < 16; ++i)
	{
		const GLfloat expected_near = depth_data[i * 2 + 0];
		const GLfloat expected_far  = depth_data[i * 2 + 1];

		/* Bottom row should contain near values, top one should contain far values */
		const GLfloat near = texture_data[i];
		const GLfloat far  = texture_data[i + 16];

		if ((expected_near != near) || (expected_far != far))
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid values at " << i << " expected ["
												<< expected_near << ", " << expected_far << "] got [" << near << ", "
												<< far << "]" << tcu::TestLog::EndMessage;

			check_result = false;
			break;
		}
	}

	return check_result;
}